

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numcontext.cpp
# Opt level: O2

void __thiscall NumContext::NumContext(NumContext *this,int num)

{
  string *this_00;
  allocator<char> local_89;
  string local_88 [32];
  char buf [64];
  
  Context::Context(&this->super_Context);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__NumContext_00104d40;
  sprintf(buf,"%d",num);
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>(this_00,buf,&local_89);
  std::__cxx11::string::string(local_88,this_00);
  (*(this->super_Context)._vptr_Context[3])(this,local_88);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

NumContext::NumContext(int num)
{
	char buf[64];
	sprintf(buf,"%d", num);

	setData(*(new string(buf)));
}